

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

Abc_Obj_t * Abc_SclAddOneInv(Bus_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts,float Gain)

{
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj_00;
  SC_Cell *p_01;
  int Fill;
  int i;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float Entry;
  float Entry_00;
  float Entry_01;
  float fVar8;
  
  i = 0;
  fVar4 = SC_CellPinCap(p->pInv,0);
  iVar3 = p->pPars->nDegree;
  iVar2 = vFanouts->nSize;
  if (iVar3 < vFanouts->nSize) {
    iVar2 = iVar3;
  }
  Bus_SclCheckSortedFanout(vFanouts);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  fVar8 = 0.0;
  do {
    iVar3 = iVar2;
    if (iVar2 == i) break;
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,i);
    fVar5 = Abc_SclFindWireLoad(p->vWireCaps,i);
    i = i + 1;
    fVar6 = Abc_SclFindWireLoad(p->vWireCaps,i);
    fVar7 = Bus_SclObjCin(pAVar1);
    fVar8 = fVar8 + (fVar7 - fVar5) + fVar6;
    iVar3 = i;
  } while (fVar8 <= fVar4 * Gain);
  if (p->pPars->fAddBufs == 0) {
    pAVar1 = Abc_NtkCreateNodeInv(p->pNtk,(Abc_Obj_t *)0x0);
    fVar4 = extraout_XMM0_Da_00;
  }
  else {
    pAVar1 = Abc_NtkCreateNodeBuf(p->pNtk,(Abc_Obj_t *)0x0);
    fVar4 = extraout_XMM0_Da;
  }
  if (pAVar1->Id != p->vCins->nSize) {
    __assert_fail("(int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                  ,0x170,"Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)"
                 );
  }
  Vec_FltPush(p->vCins,fVar4);
  Vec_FltPush(p->vETimes,Entry);
  Vec_FltPush(p->vLoads,Entry_00);
  Vec_FltPush(p->vDepts,Entry_01);
  iVar2 = 2;
  if (2 < iVar3) {
    iVar2 = iVar3;
  }
  if (vFanouts->nSize <= iVar2) {
    iVar2 = vFanouts->nSize;
  }
  iVar3 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    iVar3 = 0;
  }
  for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,iVar3);
    Vec_PtrWriteEntry(vFanouts,iVar3,(void *)0x0);
    if ((pObj_00->vFanins).nSize == 0) {
      Abc_ObjAddFanin(pObj_00,pAVar1);
    }
    else {
      Abc_ObjPatchFanin(pObj_00,pObj,pAVar1);
    }
  }
  p_01 = Abc_SclFindSmallestGate(p->pInv,fVar8 / Gain);
  p_00 = p->pNtk->vGates;
  iVar3 = pAVar1->Id;
  iVar2 = p_01->Id;
  Vec_IntFillExtra(p_00,iVar3 + 1,Fill);
  Vec_IntWriteEntry(p_00,iVar3,iVar2);
  Abc_NtkComputeNodeDeparture(pAVar1,(float)p->pPars->Slew);
  fVar4 = Abc_NtkComputeNodeLoad(p,pAVar1);
  if ((fVar4 - fVar8 < 1.0) && (fVar8 - fVar4 < 1.0)) {
    fVar4 = SC_CellPinCap(p_01,0);
    Bus_SclObjSetCin(pAVar1,fVar4);
    fVar4 = Abc_NtkComputeEdgeDept(pAVar1,0,(float)p->pPars->Slew);
    Bus_SclObjSetETime(pAVar1,fVar4);
    if ((p->pNtk->vPhases != (Vec_Int_t *)0x0) && (iVar3 = Abc_SclIsInv(pAVar1), iVar3 != 0)) {
      Abc_NodeInvUpdateFanPolarity(pAVar1);
    }
    return pAVar1;
  }
  __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                ,0x184,"Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)");
}

Assistant:

Abc_Obj_t * Abc_SclAddOneInv( Bus_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts, float Gain )
{
    SC_Cell * pCellNew;
    Abc_Obj_t * pFanout, * pInv;
    float Target = SC_CellPinCap(p->pInv, 0) * Gain;
    float LoadWirePrev, LoadWireThis, LoadNew, Load = 0;
    int Limit = Abc_MinInt( p->pPars->nDegree, Vec_PtrSize(vFanouts) );
    int i, iStop;
    Bus_SclCheckSortedFanout( vFanouts );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, iStop, Limit )
    {
        LoadWirePrev = Abc_SclFindWireLoad( p->vWireCaps, iStop );
        LoadWireThis = Abc_SclFindWireLoad( p->vWireCaps, iStop+1 );
        Load += Bus_SclObjCin( pFanout ) - LoadWirePrev + LoadWireThis;
        if ( Load > Target )
        {
            iStop++;
            break;
        }
    }
    // create inverter
    if ( p->pPars->fAddBufs )
        pInv = Abc_NtkCreateNodeBuf( p->pNtk, NULL );
    else
        pInv = Abc_NtkCreateNodeInv( p->pNtk, NULL );
    assert( (int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins) );
    Vec_FltPush( p->vCins,   0 );
    Vec_FltPush( p->vETimes, 0 );
    Vec_FltPush( p->vLoads,  0 );
    Vec_FltPush( p->vDepts,  0 );
    Limit = Abc_MinInt( Abc_MaxInt(iStop, 2), Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Limit )
    {
        Vec_PtrWriteEntry( vFanouts, i, NULL );
        if ( Abc_ObjFaninNum(pFanout) == 0 )
            Abc_ObjAddFanin( pFanout, pInv );
        else
            Abc_ObjPatchFanin( pFanout, pObj, pInv );
    }
    // set the gate
    pCellNew = Abc_SclFindSmallestGate( p->pInv, Load / Gain );
    Vec_IntSetEntry( p->pNtk->vGates, Abc_ObjId(pInv), pCellNew->Id );
    // set departure and load
    Abc_NtkComputeNodeDeparture( pInv, p->pPars->Slew );
    LoadNew = Abc_NtkComputeNodeLoad( p, pInv );
    assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
    // set fanout info for the inverter
    Bus_SclObjSetCin( pInv, SC_CellPinCap(pCellNew, 0) );
    Bus_SclObjSetETime( pInv, Abc_NtkComputeEdgeDept(pInv, 0, p->pPars->Slew) );
    // update phases
    if ( p->pNtk->vPhases && Abc_SclIsInv(pInv) )
        Abc_NodeInvUpdateFanPolarity( pInv );
    return pInv;
}